

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

void VOX_AddVoxel(int sprnum,int frame,FVoxelDef *def)

{
  long lVar1;
  byte bVar2;
  spritedef_t *psVar3;
  spriteframe_t *psVar4;
  WORD WVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 *puVar11;
  spriteframe_t *psVar12;
  spriteframe_t *psVar13;
  byte bVar14;
  
  psVar3 = sprites.Array;
  bVar14 = 0;
  bVar2 = sprites.Array[sprnum].numframes;
  if ((int)(uint)bVar2 <= frame) {
    lVar1 = (long)frame + 1;
    uVar10 = (uint)lVar1;
    if ((bVar2 == 0) ||
       ((uint)sprites.Array[sprnum].spriteframes + (uint)bVar2 == SpriteFrames.Count)) {
      uVar10 = uVar10 - bVar2;
      TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,uVar10);
      uVar6 = SpriteFrames.Count;
      uVar10 = uVar10 + SpriteFrames.Count;
      if (psVar3[sprnum].numframes == '\0') {
        WVar5 = (WORD)SpriteFrames.Count;
        SpriteFrames.Count = uVar10;
        psVar3[sprnum].spriteframes = WVar5;
        uVar10 = SpriteFrames.Count;
      }
    }
    else {
      TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,uVar10);
      uVar6 = SpriteFrames.Count;
      psVar4 = SpriteFrames.Array;
      SpriteFrames.Count = SpriteFrames.Count + uVar10;
      if (psVar3[sprnum].numframes == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        psVar13 = SpriteFrames.Array;
        do {
          uVar7 = (ulong)((uint)psVar3[sprnum].spriteframes * 0x50);
          uVar10 = uVar6 + (int)uVar9;
          psVar4[uVar10].Flip = *(WORD *)((long)(psVar13->Texture + 0x10) + uVar7);
          puVar11 = (undefined8 *)((long)&((spriteframe_t *)(psVar13->Texture + -2))->Voxel + uVar7)
          ;
          psVar12 = psVar4 + uVar10;
          for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
            psVar12->Voxel = (FVoxelDef *)*puVar11;
            puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
            psVar12 = (spriteframe_t *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
          }
          uVar9 = uVar9 + 1;
          psVar13 = psVar13 + 1;
        } while (uVar9 < psVar3[sprnum].numframes);
      }
      psVar3[sprnum].spriteframes = (WORD)uVar6;
      uVar6 = uVar6 + (int)uVar9;
      uVar10 = SpriteFrames.Count;
    }
    SpriteFrames.Count = uVar10;
    memset(SpriteFrames.Array + uVar6,0,(lVar1 - (ulong)psVar3[sprnum].numframes) * 0x50);
    psVar3[sprnum].numframes = (BYTE)lVar1;
  }
  SpriteFrames.Array[(ulong)sprites.Array[sprnum].spriteframes + (long)frame].Voxel = def;
  return;
}

Assistant:

void VOX_AddVoxel(int sprnum, int frame, FVoxelDef *def)
{
	R_ExtendSpriteFrames(sprites[sprnum], frame);
	SpriteFrames[sprites[sprnum].spriteframes + frame].Voxel = def;
}